

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O3

void __thiscall
CVmImageWriter::begin_objs_block
          (CVmImageWriter *this,uint metaclass_idx,int large_objects,int trans)

{
  CVmFile *pCVar1;
  long lVar2;
  uint16_t tmp;
  uint16_t tmp_1;
  char buf [16];
  char local_38 [2];
  undefined2 local_36;
  ushort local_34;
  
  begin_block(this,"OBJS",1);
  local_34 = (large_objects != 0) + 2;
  if (trans == 0) {
    local_34 = (ushort)(large_objects != 0);
  }
  pCVar1 = this->fp_;
  lVar2 = ftell((FILE *)pCVar1->fp_);
  this->objs_prefix_ = lVar2 - pCVar1->seek_base_;
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_36 = (short)metaclass_idx;
  CVmFile::write_bytes(this->fp_,local_38,6);
  return;
}

Assistant:

void CVmImageWriter::begin_objs_block(uint metaclass_idx, int large_objects,
                                      int trans)
{
    char buf[16];
    uint flags;

    /* begin the block */
    begin_block("OBJS", TRUE);

    /* prepare the flags */
    flags = 0;
    if (large_objects)
        flags |= 1;
    if (trans)
        flags |= 2;

    /* remember where the prefix goes so we can fix it up later */
    objs_prefix_ = fp_->get_pos();

    /* 
     *   write a placeholder object count, the metaclass dependency table
     *   index, and the OBJS flags 
     */
    oswp2(buf, 0);
    oswp2(buf + 2, metaclass_idx);
    oswp2(buf + 4, flags);

    /* write the prefix */
    fp_->write_bytes(buf, 6);
}